

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode calc_s3_payload_hash
                   (Curl_easy *data,Curl_HttpReq httpreq,char *provider1,uchar *sha_hash,
                   char *sha_hex,char *header)

{
  CURLcode CVar1;
  bool bVar2;
  bool bVar3;
  size_t len;
  CURLcode ret;
  _Bool post_payload;
  _Bool empty_payload;
  _Bool empty_method;
  char *header_local;
  char *sha_hex_local;
  uchar *sha_hash_local;
  char *provider1_local;
  Curl_HttpReq httpreq_local;
  Curl_easy *data_local;
  
  bVar2 = true;
  if (httpreq != HTTPREQ_GET && httpreq != HTTPREQ_HEAD) {
    bVar2 = (data->set).filesize == 0;
  }
  bVar3 = false;
  if (httpreq == HTTPREQ_POST) {
    bVar3 = (data->set).postfields != (void *)0x0;
  }
  if ((bVar2) || (bVar3)) {
    CVar1 = calc_payload_hash(data,sha_hash,sha_hex);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
  }
  else {
    memcpy(sha_hex,"UNSIGNED-PAYLOAD",0x10);
    sha_hex[0x10] = '\0';
  }
  curl_msnprintf(header,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
  return CURLE_OK;
}

Assistant:

static CURLcode calc_s3_payload_hash(struct Curl_easy *data,
                                     Curl_HttpReq httpreq, char *provider1,
                                     unsigned char *sha_hash,
                                     char *sha_hex, char *header)
{
  bool empty_method = (httpreq == HTTPREQ_GET || httpreq == HTTPREQ_HEAD);
  /* The request method or filesize indicate no request payload */
  bool empty_payload = (empty_method || data->set.filesize == 0);
  /* The POST payload is in memory */
  bool post_payload = (httpreq == HTTPREQ_POST && data->set.postfields);
  CURLcode ret = CURLE_OUT_OF_MEMORY;

  if(empty_payload || post_payload) {
    /* Calculate a real hash when we know the request payload */
    ret = calc_payload_hash(data, sha_hash, sha_hex);
    if(ret)
      goto fail;
  }
  else {
    /* Fall back to s3's UNSIGNED-PAYLOAD */
    size_t len = sizeof(S3_UNSIGNED_PAYLOAD) - 1;
    DEBUGASSERT(len < SHA256_HEX_LENGTH); /* 16 < 65 */
    memcpy(sha_hex, S3_UNSIGNED_PAYLOAD, len);
    sha_hex[len] = 0;
  }

  /* format the required content-sha256 header */
  msnprintf(header, CONTENT_SHA256_HDR_LEN,
            "x-%s-content-sha256: %s", provider1, sha_hex);

  ret = CURLE_OK;
fail:
  return ret;
}